

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsLib.cpp
# Opt level: O1

long AdsSyncWriteControlReqEx
               (long port,AmsAddr *pAddr,uint16_t adsState,uint16_t devState,uint32_t bufferLength,
               void *buffer)

{
  long lVar1;
  uint16_t local_80;
  uint16_t local_7e;
  uint32_t local_7c;
  AmsRequest local_78;
  
  lVar1 = 0x748;
  if (0xffffffffffff0000 < port - 0x10000U) {
    if (pAddr == (AmsAddr *)0x0) {
      lVar1 = 0x749;
    }
    else {
      Frame::Frame(&local_78.frame,(ulong)bufferLength + 0x2e,(void *)0x0);
      local_78.port = (uint16_t)port;
      local_78.cmdId = 5;
      local_78._44_8_ = 0;
      local_78.buffer._4_4_ = 0;
      local_78.bytesRead._0_4_ = 0;
      local_78.bytesRead._4_4_ = 0;
      local_78.deadline.__d.__r = (duration)0;
      local_78.destAddr = pAddr;
      Frame::prepend(&local_78.frame,buffer,(ulong)bufferLength);
      local_80 = adsState;
      local_7e = devState;
      local_7c = bufferLength;
      Frame::prepend(&local_78.frame,&local_80,8);
      GetRouter();
      lVar1 = AmsRouter::AdsRequest(&GetRouter::router,&local_78);
      if (local_78.frame.m_Data._M_t.
          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0) {
        operator_delete__((void *)local_78.frame.m_Data._M_t.
                                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                  .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
      }
    }
  }
  return lVar1;
}

Assistant:

long AdsSyncWriteControlReqEx(long           port,
                              const AmsAddr* pAddr,
                              uint16_t       adsState,
                              uint16_t       devState,
                              uint32_t       bufferLength,
                              const void*    buffer)
{
    ASSERT_PORT_AND_AMSADDR(port, pAddr);
    try {
        AmsRequest request {
            *pAddr,
            (uint16_t)port,
            AoEHeader::WRITE_CONTROL,
            0, nullptr, nullptr,
            sizeof(AdsWriteCtrlRequest) + bufferLength
        };
        request.frame.prepend(buffer, bufferLength);
        request.frame.prepend<AdsWriteCtrlRequest>({
            adsState,
            devState,
            bufferLength
        });
        return GetRouter().AdsRequest(request);
    } catch (const std::bad_alloc&) {
        return GLOBALERR_NO_MEMORY;
    }
}